

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::FCDUTF8CollationIterator::handleNextCE32
          (FCDUTF8CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  int32_t *pi;
  long lVar1;
  byte bVar2;
  short sVar3;
  State SVar4;
  uint8_t *s;
  UTrie2 *pUVar5;
  bool bVar6;
  UBool UVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  char16_t *pcVar11;
  uint32_t *puVar12;
  uint uVar13;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *pUVar14;
  UErrorCode *extraout_RDX_01;
  UErrorCode *extraout_RDX_02;
  UErrorCode *extraout_RDX_03;
  UErrorCode *extraout_RDX_04;
  uint32_t unaff_EBP;
  uint uVar15;
  int iVar16;
  int iVar17;
  
  pi = &(this->super_UTF8CollationIterator).pos;
  pUVar14 = errorCode;
  do {
    while (SVar4 = this->state, SVar4 == IN_FCD_SEGMENT) {
      if ((this->super_UTF8CollationIterator).pos != this->limit) {
        uVar10 = UTF8CollationIterator::handleNextCE32(&this->super_UTF8CollationIterator,c,pUVar14)
        ;
        return uVar10;
      }
LAB_00221779:
      switchToForward(this);
      pUVar14 = extraout_RDX_00;
    }
    if (SVar4 == IN_NORMALIZED) {
      sVar3 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        uVar13 = (this->normalized).fUnion.fFields.fLength;
      }
      else {
        uVar13 = (int)sVar3 >> 5;
      }
      uVar9 = (this->super_UTF8CollationIterator).pos;
      if (uVar9 == uVar13) goto LAB_00221779;
      (this->super_UTF8CollationIterator).pos = uVar9 + 1;
      uVar15 = 0xffff;
      if (uVar9 < uVar13) {
        if (((int)sVar3 & 2U) == 0) {
          pcVar11 = (this->normalized).fUnion.fFields.fArray;
        }
        else {
          pcVar11 = (char16_t *)((long)&(this->normalized).fUnion + 2);
        }
        uVar15 = (uint)(ushort)pcVar11[(int)uVar9];
      }
      *c = uVar15;
      goto LAB_00221995;
    }
    if (SVar4 != CHECK_FWD) goto LAB_00221779;
    iVar17 = (this->super_UTF8CollationIterator).pos;
    if (iVar17 == (this->super_UTF8CollationIterator).length) {
      *c = -1;
      return 0xc0;
    }
    s = (this->super_UTF8CollationIterator).u8;
    (this->super_UTF8CollationIterator).pos = iVar17 + 1;
    bVar2 = s[iVar17];
    uVar13 = (uint)bVar2;
    *c = uVar13;
    if (-1 < (char)bVar2) {
      puVar12 = ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32;
      goto LAB_002219b4;
    }
    uVar13 = (uint)bVar2;
    if (((bVar2 & 0xf0) == 0xe0) &&
       (iVar17 = (this->super_UTF8CollationIterator).pos,
       iVar16 = (this->super_UTF8CollationIterator).length, iVar17 + 1 < iVar16 || iVar16 < 0)) {
      if ((((byte)" 000000000000\x1000"[uVar13 & 0xf] >> (s[iVar17] >> 5) & 1) == 0) ||
         (0x3f < (byte)(s[(long)iVar17 + 1] ^ 0x80))) goto LAB_00221786;
      uVar13 = (s[iVar17] & 0x3f) << 6 | (uVar13 & 0xf) << 0xc | s[(long)iVar17 + 1] ^ 0x80;
      pUVar14 = (UErrorCode *)(ulong)uVar13;
      *c = uVar13;
      iVar16 = *pi;
      iVar8 = iVar16 + 2;
      *pi = iVar8;
      uVar13 = *c;
      iVar17 = 2;
      if ((((0xbf < (int)uVar13) &&
           (pUVar14 = (UErrorCode *)(ulong)(byte)CollationFCD::tcccIndex[uVar13 >> 5],
           pUVar14 != (UErrorCode *)0x0)) &&
          (lVar1 = (long)pUVar14 * 4,
          pUVar14 = (UErrorCode *)(ulong)*(uint *)(CollationFCD::tcccBits + lVar1),
          (*(uint *)(CollationFCD::tcccBits + lVar1) >> (uVar13 & 0x1f) & 1) != 0)) &&
         (((uVar13 & 0x1fff01) == 0xf01 ||
          ((iVar8 != (this->super_UTF8CollationIterator).length &&
           (UVar7 = nextHasLccc(this), pUVar14 = extraout_RDX, UVar7 != '\0')))))) {
        iVar16 = iVar16 + -1;
LAB_002218eb:
        *pi = iVar16;
        uVar10 = unaff_EBP;
LAB_00221927:
        UVar7 = nextSegment(this,errorCode);
        iVar17 = 3;
        pUVar14 = extraout_RDX_04;
        unaff_EBP = uVar10;
        if (UVar7 == '\0') {
          *c = -1;
          iVar17 = 1;
          unaff_EBP = 0xc0;
        }
      }
    }
    else {
LAB_00221786:
      if ((((byte)(bVar2 + 0x3e) < 0x1e) &&
          (iVar17 = (this->super_UTF8CollationIterator).pos,
          iVar17 != (this->super_UTF8CollationIterator).length)) &&
         (uVar9 = s[iVar17] ^ 0x80, (byte)uVar9 < 0x40)) {
        pUVar5 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
        puVar12 = pUVar5->data32;
        uVar10 = puVar12[pUVar5->index[(ulong)bVar2 + 0x760] + uVar9];
        *c = (uVar13 & 0x1f) << 6 | uVar9;
        iVar16 = (this->super_UTF8CollationIterator).pos;
        iVar17 = iVar16 + 1;
        (this->super_UTF8CollationIterator).pos = iVar17;
        uVar13 = *c;
        pUVar14 = (UErrorCode *)CONCAT71((int7)((ulong)puVar12 >> 8),1);
        if ((0xbf < (int)uVar13) && ((ulong)(byte)CollationFCD::tcccIndex[uVar13 >> 5] != 0)) {
          pUVar14 = (UErrorCode *)
                    (ulong)CONCAT31((int3)(*(uint *)(CollationFCD::tcccBits +
                                                    (ulong)(byte)CollationFCD::tcccIndex
                                                                 [uVar13 >> 5] * 4) >> 8),
                                    (*(uint *)(CollationFCD::tcccBits +
                                              (ulong)(byte)CollationFCD::tcccIndex[uVar13 >> 5] * 4)
                                     >> (uVar13 & 0x1f) & 1) == 0);
        }
        bVar6 = false;
        if (((char)pUVar14 == '\0') && (iVar17 != (this->super_UTF8CollationIterator).length)) {
          UVar7 = nextHasLccc(this);
          pUVar14 = extraout_RDX_01;
          if (UVar7 == '\0') {
            bVar6 = false;
          }
          else {
            *pi = iVar16 + -1;
            bVar6 = true;
            uVar10 = unaff_EBP;
          }
        }
        iVar17 = 1;
        unaff_EBP = uVar10;
        if (bVar6) goto LAB_00221927;
      }
      else {
        uVar13 = utf8_nextCharSafeBody_63(s,pi,(this->super_UTF8CollationIterator).length,uVar13,-3)
        ;
        *c = uVar13;
        iVar17 = 1;
        if (uVar13 == 0xfffd) {
          unaff_EBP = 0xfffd0505;
          pUVar14 = extraout_RDX_02;
        }
        else {
          uVar9 = (uVar13 >> 10) + 0xd7c0 & 0xffff;
          if (((0xbf < uVar9) && ((ulong)(byte)CollationFCD::tcccIndex[uVar9 >> 5] != 0)) &&
             (((*(uint *)(CollationFCD::tcccBits +
                         (ulong)(byte)CollationFCD::tcccIndex[uVar9 >> 5] * 4) >>
                (uVar13 >> 10 & 0x1f) & 1) != 0 &&
              ((iVar16 = (this->super_UTF8CollationIterator).pos,
               iVar16 != (this->super_UTF8CollationIterator).length &&
               (UVar7 = nextHasLccc(this), UVar7 != '\0')))))) {
            iVar16 = iVar16 + -4;
            goto LAB_002218eb;
          }
          unaff_EBP = CollationData::getCE32FromSupplementary
                                ((this->super_UTF8CollationIterator).super_CollationIterator.data,
                                 uVar13);
          pUVar14 = extraout_RDX_03;
        }
      }
    }
  } while (iVar17 == 3);
  if (iVar17 != 1) {
LAB_00221995:
    pUVar5 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
    puVar12 = pUVar5->data32;
    uVar13 = (*c & 0x1fU) + (uint)pUVar5->index[*c >> 5] * 4;
LAB_002219b4:
    unaff_EBP = puVar12[uVar13];
  }
  return unaff_EBP;
}

Assistant:

uint32_t
FCDUTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == CHECK_FWD) {
            // Combination of UTF8CollationIterator::handleNextCE32() with FCD check fastpath.
            if(pos == length) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = u8[pos++];
            if(U8_IS_SINGLE(c)) {
                // ASCII 00..7F
                return trie->data32[c];
            }
            uint8_t t1, t2;
            if(0xe0 <= c && c < 0xf0 &&
                    ((pos + 1) < length || length < 0) &&
                    U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
                    (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
                // U+0800..U+FFFF except surrogates
                c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
                pos += 2;
                if(CollationFCD::hasTccc(c) &&
                        (CollationFCD::maybeTibetanCompositeVowel(c) ||
                            (pos != length && nextHasLccc()))) {
                    pos -= 3;
                } else {
                    break;  // return CE32(BMP)
                }
            } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
                // U+0080..U+07FF
                uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
                c = ((c & 0x1f) << 6) | t1;
                ++pos;
                if(CollationFCD::hasTccc(c) && pos != length && nextHasLccc()) {
                    pos -= 2;
                } else {
                    return ce32;
                }
            } else {
                // Function call for supplementary code points and error cases.
                // Illegal byte sequences yield U+FFFD.
                c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
                if(c == 0xfffd) {
                    return Collation::FFFD_CE32;
                } else {
                    U_ASSERT(c > 0xffff);
                    if(CollationFCD::hasTccc(U16_LEAD(c)) && pos != length && nextHasLccc()) {
                        pos -= 4;
                    } else {
                        return data->getCE32FromSupplementary(c);
                    }
                }
            }
            if(!nextSegment(errorCode)) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            continue;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            return UTF8CollationIterator::handleNextCE32(c, errorCode);
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}